

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O2

string * __thiscall
ZXing::ToString<long_long,void>(string *__return_storage_ptr__,ZXing *this,longlong val,int len)

{
  long *plVar1;
  ulong uVar2;
  allocator<char> local_61;
  uint *local_60;
  long local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  uint *local_40;
  long local_38;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  uVar2 = val & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)val);
  if ((long)this < 0) {
    plVar1 = (long *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Invalid value",&local_61);
    *plVar1 = (long)(plVar1 + 2);
    if (local_40 == &local_30) {
      *(uint *)(plVar1 + 2) = local_30;
      *(undefined4 *)((long)plVar1 + 0x14) = uStack_2c;
      *(undefined4 *)(plVar1 + 3) = uStack_28;
      *(undefined4 *)((long)plVar1 + 0x1c) = uStack_24;
    }
    else {
      *plVar1 = (long)local_40;
      plVar1[2] = CONCAT44(uStack_2c,local_30);
    }
    plVar1[1] = local_38;
    local_38 = 0;
    local_30 = local_30 & 0xffffff00;
    plVar1[4] = (long)"src/ZXAlgorithms.h";
    *(undefined2 *)(plVar1 + 5) = 0x70;
    *(undefined1 *)((long)plVar1 + 0x2a) = 1;
    local_40 = &local_30;
    __cxa_throw(plVar1,&Error::typeinfo,Error::~Error);
  }
  for (; (0 < (int)uVar2 && (this != (ZXing *)0x0)); this = (ZXing *)((ulong)this / 10)) {
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar2 - 1] = (byte)((ulong)this % 10) | 0x30;
    uVar2 = uVar2 - 1;
  }
  if (this != (ZXing *)0x0) {
    plVar1 = (long *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Invalid value",&local_61);
    *plVar1 = (long)(plVar1 + 2);
    if (local_60 == &local_50) {
      *(uint *)(plVar1 + 2) = local_50;
      *(undefined4 *)((long)plVar1 + 0x14) = uStack_4c;
      *(undefined4 *)(plVar1 + 3) = uStack_48;
      *(undefined4 *)((long)plVar1 + 0x1c) = uStack_44;
    }
    else {
      *plVar1 = (long)local_60;
      plVar1[2] = CONCAT44(uStack_4c,local_50);
    }
    plVar1[1] = local_58;
    local_58 = 0;
    local_50 = local_50 & 0xffffff00;
    plVar1[4] = (long)"src/ZXAlgorithms.h";
    *(undefined2 *)(plVar1 + 5) = 0x74;
    *(undefined1 *)((long)plVar1 + 0x2a) = 1;
    local_60 = &local_50;
    __cxa_throw(plVar1,&Error::typeinfo,Error::~Error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}